

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O0

unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> __thiscall
wabt::LexerSourceFile::Clone(LexerSourceFile *this)

{
  bool bVar1;
  Result RVar2;
  LexerSourceFile *this_00;
  pointer pLVar3;
  long *in_RSI;
  bool local_7e;
  undefined8 local_48;
  Offset offset;
  string_view local_30;
  unique_ptr<wabt::LexerSourceFile,_std::default_delete<wabt::LexerSourceFile>_> local_20;
  unique_ptr<wabt::LexerSourceFile,_std::default_delete<wabt::LexerSourceFile>_> result;
  LexerSourceFile *this_local;
  
  this_00 = (LexerSourceFile *)operator_new(0x30);
  string_view::string_view(&local_30,(string *)(in_RSI + 1));
  LexerSourceFile(this_00,local_30);
  std::unique_ptr<wabt::LexerSourceFile,std::default_delete<wabt::LexerSourceFile>>::
  unique_ptr<std::default_delete<wabt::LexerSourceFile>,void>
            ((unique_ptr<wabt::LexerSourceFile,std::default_delete<wabt::LexerSourceFile>> *)
             &local_20,this_00);
  local_48 = 0;
  RVar2.enum_ = (**(code **)(*in_RSI + 0x18))(in_RSI,&local_48);
  bVar1 = Failed(RVar2);
  local_7e = true;
  if (!bVar1) {
    pLVar3 = std::unique_ptr<wabt::LexerSourceFile,_std::default_delete<wabt::LexerSourceFile>_>::
             operator->(&local_20);
    RVar2.enum_ = (*(pLVar3->super_LexerSource)._vptr_LexerSource[6])(pLVar3,local_48);
    local_7e = Failed(RVar2);
  }
  if (local_7e != false) {
    std::unique_ptr<wabt::LexerSourceFile,_std::default_delete<wabt::LexerSourceFile>_>::reset
              (&local_20,(pointer)0x0);
  }
  std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>::
  unique_ptr<wabt::LexerSourceFile,std::default_delete<wabt::LexerSourceFile>,void>
            ((unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>> *)this,&local_20)
  ;
  std::unique_ptr<wabt::LexerSourceFile,_std::default_delete<wabt::LexerSourceFile>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<wabt::LexerSource,_std::default_delete<wabt::LexerSource>,_true,_true>)
         (__uniq_ptr_data<wabt::LexerSource,_std::default_delete<wabt::LexerSource>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<LexerSource> LexerSourceFile::Clone() {
  std::unique_ptr<LexerSourceFile> result(new LexerSourceFile(filename_));

  Offset offset = 0;
  if (Failed(Tell(&offset)) || Failed(result->Seek(offset))) {
    result.reset();
  }

  return std::move(result);
}